

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-RingBuffer.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_21d7::RingBufferTest_Simple_Test::TestBody(RingBufferTest_Simple_Test *this)

{
  bool bVar1;
  char *pcVar2;
  char *in_R9;
  int iVar3;
  ulong uVar4;
  int iVar5;
  int i;
  int iVar6;
  int iVar7;
  AssertionResult gtest_ar_;
  Data_t v;
  AssertionResult gtest_ar;
  uint TEST_SIZE;
  AssertHelper local_88;
  Message local_80;
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_78;
  AssertHelper local_70;
  unsigned_short local_62;
  string local_60;
  void *local_40;
  uint local_34;
  
  local_34 = 0x100;
  local_40 = operator_new(0x200);
  iVar6 = 0;
  iVar5 = 0;
  iVar7 = 0;
  do {
    iVar3 = 0x100;
    if (iVar7 != 0x100) {
      *(short *)((long)local_40 + (long)iVar5 * 2) = (short)iVar6;
      bVar1 = 0xfe < iVar5;
      iVar5 = iVar5 + 1;
      if (bVar1) {
        iVar5 = 0;
      }
      iVar3 = iVar7 + 1;
    }
    local_80.ss_.ptr_._0_4_ = CONCAT31(local_80.ss_.ptr_._1_3_,iVar7 != 0x100);
    local_88.data_._0_1_ = 1;
    testing::internal::CmpHelperEQ<bool,bool>
              ((internal *)&local_60,"rb.push(i)","true",(bool *)&local_80,(bool *)&local_88);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_80);
      pcVar2 = "";
      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x49,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    iVar6 = iVar6 + 1;
    iVar7 = iVar3;
  } while (iVar6 != 0x100);
  local_80.ss_.ptr_._0_4_ = iVar3;
  testing::internal::CmpHelperEQ<int,unsigned_int>
            ((internal *)&local_60,"rb.length()","TEST_SIZE",(int *)&local_80,&local_34);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_80);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x4a,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  iVar7 = 0x100;
  if (iVar3 != 0x100) {
    *(undefined2 *)((long)local_40 + (long)iVar5 * 2) = 0;
    iVar7 = iVar3 + 1;
  }
  local_80.ss_.ptr_._0_4_ = CONCAT31(local_80.ss_.ptr_._1_3_,iVar3 != 0x100);
  local_88.data_._0_1_ = 0;
  testing::internal::CmpHelperEQ<bool,bool>
            ((internal *)&local_60,"rb.push(0)","false",(bool *)&local_80,(bool *)&local_88);
  if ((char)local_60._M_dataplus._M_p == '\0') {
    testing::Message::Message(&local_80);
    if ((undefined8 *)local_60._M_string_length == (undefined8 *)0x0) {
      pcVar2 = "";
    }
    else {
      pcVar2 = *(char **)local_60._M_string_length;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_88,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x4b,pcVar2);
    testing::internal::AssertHelper::operator=(&local_88,&local_80);
    testing::internal::AssertHelper::~AssertHelper(&local_88);
    if (CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) + 8))();
      }
    }
  }
  uVar4 = 0;
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
         *)&local_60._M_string_length,
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  local_70.data_._0_4_ = 0;
  do {
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)&local_60,"rb[i]","i",(unsigned_short *)((long)local_40 + uVar4 * 2),
               (int *)&local_70);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_80);
      pcVar2 = "";
      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x4d,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_._0_4_ = (uint)local_70.data_ + 1;
    uVar4 = (ulong)(uint)local_70.data_;
  } while ((uint)local_70.data_ < 0x100);
  local_70.data_._0_4_ = 0;
  iVar5 = 0;
  do {
    if (iVar7 == 0) {
      iVar7 = 0;
      local_62 = 0;
    }
    else {
      local_62 = *(unsigned_short *)((long)local_40 + (long)iVar5 * 2);
      bVar1 = 0xfe < iVar5;
      iVar5 = iVar5 + 1;
      if (bVar1) {
        iVar5 = 0;
      }
      iVar7 = iVar7 + -1;
    }
    testing::internal::CmpHelperEQ<unsigned_short,int>
              ((internal *)&local_60,"v","i",&local_62,(int *)&local_70);
    if ((char)local_60._M_dataplus._M_p == '\0') {
      testing::Message::Message(&local_80);
      pcVar2 = "";
      if ((undefined8 *)local_60._M_string_length != (undefined8 *)0x0) {
        pcVar2 = *(char **)local_60._M_string_length;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_88,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
                 ,0x50,pcVar2);
      testing::internal::AssertHelper::operator=(&local_88,&local_80);
      testing::internal::AssertHelper::~AssertHelper(&local_88);
      if (CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != 0) {
        bVar1 = testing::internal::IsTrue(true);
        if ((bVar1) &&
           ((long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) != (long *)0x0)) {
          (**(code **)(*(long *)CONCAT44(local_80.ss_.ptr_._4_4_,(int)local_80.ss_.ptr_) + 8))();
        }
      }
    }
    testing::internal::
    scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
    reset((scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *)&local_60._M_string_length,
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
    local_70.data_._0_4_ = (uint)local_70.data_ + 1;
  } while ((uint)local_70.data_ < 0x100);
  local_80.ss_.ptr_._0_4_ = CONCAT31(local_80.ss_.ptr_._1_3_,iVar7 == 0);
  local_78.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (iVar7 != 0) {
    testing::Message::Message((Message *)&local_88);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_60,(internal *)&local_80,(AssertionResult *)"rb.isEmpty()","false","true",
               in_R9);
    testing::internal::AssertHelper::AssertHelper
              (&local_70,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/qywx[P]RingBuffer/test/gtest-RingBuffer.cpp"
               ,0x52,(char *)CONCAT71(local_60._M_dataplus._M_p._1_7_,
                                      (char)local_60._M_dataplus._M_p));
    testing::internal::AssertHelper::operator=(&local_70,(Message *)&local_88);
    testing::internal::AssertHelper::~AssertHelper(&local_70);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p) !=
        &local_60.field_2) {
      operator_delete((undefined1 *)
                      CONCAT71(local_60._M_dataplus._M_p._1_7_,(char)local_60._M_dataplus._M_p));
    }
    if (CONCAT71(local_88.data_._1_7_,local_88.data_._0_1_) != 0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) && ((long *)CONCAT71(local_88.data_._1_7_,local_88.data_._0_1_) != (long *)0x0)) {
        (**(code **)(*(long *)CONCAT71(local_88.data_._1_7_,local_88.data_._0_1_) + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_78,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  operator_delete(local_40);
  return;
}

Assistant:

TEST( RingBufferTest,  Simple )
	{
		constexpr unsigned TEST_SIZE = 256;
		RingBuffer<uint16_t> rb(TEST_SIZE);
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb.push(i), true );
		EXPECT_EQ( rb.length(), TEST_SIZE);
		EXPECT_EQ( rb.push(0), false );  // buffer overflow. failed to push
		for( int i=0; i<TEST_SIZE ; ++i )
			EXPECT_EQ( rb[i], i );
		for( int i=0; i<TEST_SIZE ; ++i ) {
			auto v = rb.pop(); 
			EXPECT_EQ( v, i);
		}
		EXPECT_TRUE( rb.isEmpty() );
	}